

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_54::YieldPromiseNode::get(YieldPromiseNode *this,ExceptionOrValue *output)

{
  ExceptionOrValue local_178;
  char local_18;
  
  local_178.exception.ptr.isSet = false;
  local_18 = '\x01';
  kj::_::ExceptionOrValue::operator=(output,&local_178);
  if (&local_178 != output) {
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
    }
    if (local_18 == '\x01') {
      output[1].exception.ptr.isSet = true;
    }
  }
  if (local_178.exception.ptr.isSet == true) {
    Exception::~Exception(&local_178.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void get(_::ExceptionOrValue& output) noexcept override {
    output.as<_::Void>() = _::Void();
  }